

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool.cxx
# Opt level: O3

bool __thiscall
cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool::GetFileInfo
          (cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool *this,string *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *needed,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *rpaths,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runpaths)

{
  cmRuntimeDependencyArchive *this_00;
  undefined8 uVar1;
  cmBinUtilsLinuxELFGetRuntimeDependenciesTool *this_01;
  bool bVar2;
  char cVar3;
  int iVar4;
  istream *piVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rpath;
  StdioConfiguration SVar6;
  cmUVProcessChain process;
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_> status
  ;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  ostringstream e;
  cmUVProcessChainBuilder builder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  undefined1 local_250 [40];
  undefined1 local_228 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  cmBinUtilsLinuxELFGetRuntimeDependenciesTool *local_1e8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1e0;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [4];
  char *local_188;
  char *local_180;
  ios_base local_168 [48];
  char *local_138;
  cmUVProcessChainBuilder local_60;
  
  local_250._32_8_ = file;
  local_1e0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)needed;
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&local_60);
  cmUVProcessChainBuilder::SetBuiltinStream(&local_60,Stream_OUTPUT);
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_cmBinUtilsLinuxELFGetRuntimeDependenciesTool).Archive;
  local_1d8._0_8_ = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"objdump","");
  bVar2 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesCommand
                    (this_00,(string *)local_1d8,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ != local_1c8) {
    operator_delete((void *)local_1d8._0_8_,local_1c8[0]._M_allocated_capacity + 1);
  }
  if (!bVar2) {
    local_1d8._0_8_ = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Could not find objdump","")
    ;
    cmBinUtilsLinuxELFGetRuntimeDependenciesTool::SetError
              (&this->super_cmBinUtilsLinuxELFGetRuntimeDependenciesTool,(string *)local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != local_1c8) {
      operator_delete((void *)local_1d8._0_8_,local_1c8[0]._M_allocated_capacity + 1);
    }
    bVar2 = false;
    goto LAB_003b6719;
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_208,
             (char (*) [3])"-p");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_208,(value_type *)local_250._32_8_);
  cmUVProcessChainBuilder::AddCommand(&local_60,&local_208);
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_250);
  bVar2 = cmUVProcessChain::Valid((cmUVProcessChain *)local_250);
  if (bVar2) {
    local_228._0_8_ = local_228 + 0x10;
    local_228._8_8_ = 0;
    local_228[0x10] = '\0';
    local_1e8 = &this->super_cmBinUtilsLinuxELFGetRuntimeDependenciesTool;
    if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
         ::neededRegex == '\0') &&
       (iVar4 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::neededRegex), iVar4 != 0)) {
      GetFileInfo::neededRegex.regmatch.startp[0] = (char *)0x0;
      GetFileInfo::neededRegex.regmatch.endp[0] = (char *)0x0;
      GetFileInfo::neededRegex.regmatch.searchstring = (char *)0x0;
      GetFileInfo::neededRegex.program = (char *)0x0;
      cmsys::RegularExpression::compile(&GetFileInfo::neededRegex,"^ *NEEDED *([^\n]*)$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::neededRegex,
                   &__dso_handle);
      __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                           ::neededRegex);
    }
    if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
         ::rpathRegex == '\0') &&
       (iVar4 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::rpathRegex), iVar4 != 0)) {
      GetFileInfo::rpathRegex.regmatch.startp[0] = (char *)0x0;
      GetFileInfo::rpathRegex.regmatch.endp[0] = (char *)0x0;
      GetFileInfo::rpathRegex.regmatch.searchstring = (char *)0x0;
      GetFileInfo::rpathRegex.program = (char *)0x0;
      cmsys::RegularExpression::compile(&GetFileInfo::rpathRegex,"^ *RPATH *([^\n]*)$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::rpathRegex,
                   &__dso_handle);
      __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                           ::rpathRegex);
    }
    if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
         ::runpathRegex == '\0') &&
       (iVar4 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::runpathRegex), iVar4 != 0)) {
      GetFileInfo::runpathRegex.regmatch.startp[0] = (char *)0x0;
      GetFileInfo::runpathRegex.regmatch.endp[0] = (char *)0x0;
      GetFileInfo::runpathRegex.regmatch.searchstring = (char *)0x0;
      GetFileInfo::runpathRegex.program = (char *)0x0;
      cmsys::RegularExpression::compile(&GetFileInfo::runpathRegex,"^ *RUNPATH *([^\n]*)$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::runpathRegex,
                   &__dso_handle);
      __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                           ::runpathRegex);
    }
LAB_003b618c:
    while( true ) {
      piVar5 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_250);
      cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar5 + -0x18) + (char)piVar5);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (piVar5,(string *)local_228,cVar3);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      local_1d8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_188 = (char *)0x0;
      local_138 = (char *)0x0;
      bVar2 = cmsys::RegularExpression::find
                        (&GetFileInfo::neededRegex,(char *)local_228._0_8_,
                         (RegularExpressionMatch *)local_1d8);
      if (!bVar2) {
        bVar2 = cmsys::RegularExpression::find
                          (&GetFileInfo::rpathRegex,(char *)local_228._0_8_,
                           (RegularExpressionMatch *)local_1d8);
        if (!bVar2) goto LAB_003b6281;
        if ((char *)local_1d8._8_8_ == (char *)0x0) {
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          local_270._M_string_length = 0;
          local_270.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_270,local_1d8._8_8_,local_180);
        }
        cmsys::SystemTools::SplitString
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_250 + 8),&local_270,':',false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,
                          CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                                   local_270.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(rpaths,((long)(local_250._16_8_ - local_250._8_8_) >> 5) +
                         ((long)(rpaths->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(rpaths->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5));
        uVar1 = local_250._16_8_;
        for (SVar6 = (StdioConfiguration)local_250._8_8_; SVar6 != (StdioConfiguration)uVar1;
            SVar6 = (StdioConfiguration)((long)SVar6 + 0x20)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(rpaths,(value_type *)SVar6);
        }
        goto LAB_003b644c;
      }
      if ((char *)local_1d8._8_8_ == (char *)0x0) {
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        local_270._M_string_length = 0;
        local_270.field_2._M_local_buf[0] = '\0';
      }
      else {
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_270,local_1d8._8_8_,local_180);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_1e0,&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,
                        CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                                 local_270.field_2._M_local_buf[0]) + 1);
      }
    }
    bVar2 = cmUVProcessChain::Wait((cmUVProcessChain *)local_250,-1);
    this_01 = local_1e8;
    if (bVar2) {
      cmUVProcessChain::GetStatus
                ((vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                  *)(local_250 + 8),(cmUVProcessChain *)local_250);
      if ((*(long **)local_250._8_8_ == (long *)0x0) || (**(long **)local_250._8_8_ != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"Failed to run objdump on:\n  ",0x1c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,((_Alloc_hider *)local_250._32_8_)->_M_p,
                   *(size_type *)(local_250._32_8_ + 8));
        std::__cxx11::stringbuf::str();
        cmBinUtilsLinuxELFGetRuntimeDependenciesTool::SetError(this_01,&local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,
                          CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                                   local_270.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base(local_168);
        bVar2 = false;
        if ((StdioConfiguration)local_250._8_8_ == (StdioConfiguration)0x0) goto LAB_003b66f3;
      }
      else {
        bVar2 = true;
      }
      operator_delete((void *)local_250._8_8_,local_250._24_8_ - local_250._8_8_);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"Failed to wait on objdump process for:\n  ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,((_Alloc_hider *)local_250._32_8_)->_M_p,
                 *(size_type *)(local_250._32_8_ + 8));
      std::__cxx11::stringbuf::str();
      cmBinUtilsLinuxELFGetRuntimeDependenciesTool::SetError(this_01,&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,
                        CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                                 local_270.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      std::ios_base::~ios_base(local_168);
      bVar2 = false;
    }
LAB_003b66f3:
    if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
      operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,"Failed to start objdump process for:\n  ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,((_Alloc_hider *)local_250._32_8_)->_M_p,
               *(size_type *)(local_250._32_8_ + 8));
    std::__cxx11::stringbuf::str();
    cmBinUtilsLinuxELFGetRuntimeDependenciesTool::SetError
              (&this->super_cmBinUtilsLinuxELFGetRuntimeDependenciesTool,(string *)local_228);
    if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
      operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
    std::ios_base::~ios_base(local_168);
    bVar2 = false;
  }
  cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_250);
LAB_003b6719:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208);
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&local_60.Processes);
  return bVar2;
LAB_003b6281:
  bVar2 = cmsys::RegularExpression::find
                    (&GetFileInfo::runpathRegex,(char *)local_228._0_8_,
                     (RegularExpressionMatch *)local_1d8);
  if (bVar2) {
    if ((char *)local_1d8._8_8_ == (char *)0x0) {
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      local_270._M_string_length = 0;
      local_270.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_270,local_1d8._8_8_,local_180);
    }
    cmsys::SystemTools::SplitString
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_250 + 8),&local_270,':',false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,
                      CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                               local_270.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(runpaths,((long)(local_250._16_8_ - local_250._8_8_) >> 5) +
                       ((long)(runpaths->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(runpaths->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5));
    uVar1 = local_250._16_8_;
    for (SVar6 = (StdioConfiguration)local_250._8_8_; SVar6 != (StdioConfiguration)uVar1;
        SVar6 = (StdioConfiguration)((long)SVar6 + 0x20)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(runpaths,(value_type *)SVar6);
    }
LAB_003b644c:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_250 + 8));
  }
  goto LAB_003b618c;
}

Assistant:

bool cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool::GetFileInfo(
  std::string const& file, std::vector<std::string>& needed,
  std::vector<std::string>& rpaths, std::vector<std::string>& runpaths)
{
  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT);

  std::vector<std::string> command;
  if (!this->Archive->GetGetRuntimeDependenciesCommand("objdump", command)) {
    this->SetError("Could not find objdump");
    return false;
  }
  command.emplace_back("-p");
  command.push_back(file);
  builder.AddCommand(command);

  auto process = builder.Start();
  if (!process.Valid()) {
    std::ostringstream e;
    e << "Failed to start objdump process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression neededRegex("^ *NEEDED *([^\n]*)$");
  static const cmsys::RegularExpression rpathRegex("^ *RPATH *([^\n]*)$");
  static const cmsys::RegularExpression runpathRegex("^ *RUNPATH *([^\n]*)$");
  while (std::getline(*process.OutputStream(), line)) {
    cmsys::RegularExpressionMatch match;
    if (neededRegex.find(line.c_str(), match)) {
      needed.push_back(match.match(1));
    } else if (rpathRegex.find(line.c_str(), match)) {
      std::vector<std::string> rpathSplit =
        cmSystemTools::SplitString(match.match(1), ':');
      rpaths.reserve(rpaths.size() + rpathSplit.size());
      for (auto const& rpath : rpathSplit) {
        rpaths.push_back(rpath);
      }
    } else if (runpathRegex.find(line.c_str(), match)) {
      std::vector<std::string> runpathSplit =
        cmSystemTools::SplitString(match.match(1), ':');
      runpaths.reserve(runpaths.size() + runpathSplit.size());
      for (auto const& runpath : runpathSplit) {
        runpaths.push_back(runpath);
      }
    }
  }

  if (!process.Wait()) {
    std::ostringstream e;
    e << "Failed to wait on objdump process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }
  auto status = process.GetStatus();
  if (!status[0] || status[0]->ExitStatus != 0) {
    std::ostringstream e;
    e << "Failed to run objdump on:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  return true;
}